

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

gc_vector<mjs::object::property> * __thiscall
mjs::gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
          (gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true> *this,gc_heap *h)

{
  bool bVar1;
  slot *psVar2;
  
  bVar1 = gc_heap::type_check<mjs::gc_vector<mjs::object::property>>(h,this->pos_);
  if (bVar1) {
    psVar2 = gc_heap::allocation_context::get_at(&h->alloc_context_,this->pos_);
    return (gc_vector<mjs::object::property> *)psVar2;
  }
  __assert_fail("h.type_check<T>(pos_)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1db,
                "T &mjs::gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>>::dereference(gc_heap &) const [T = mjs::gc_vector<mjs::object::property>, strong = true]"
               );
}

Assistant:

T& dereference(gc_heap& h) const {
        assert(h.type_check<T>(pos_));
        return *reinterpret_cast<T*>(h.get_at(pos_));
    }